

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestMembraneImpl::callPassThrough
          (TestMembraneImpl *this,CallPassThroughContext context)

{
  CapTableReader *pCVar1;
  CapTableBuilder *pCVar2;
  undefined8 uVar3;
  Disposer *pDVar4;
  RequestHook *pRVar5;
  TransformPromiseNodeBase *this_00;
  WirePointer *pWVar6;
  _func_int **in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  PromiseNode *extraout_RDX_01;
  PromiseNode *extraout_RDX_02;
  PromiseNode *extraout_RDX_03;
  PromiseNode *extraout_RDX_04;
  PromiseNode *extraout_RDX_05;
  PromiseNode *pPVar7;
  PromiseNode *extraout_RDX_06;
  int in_R8D;
  Promise<void> PVar8;
  Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  req;
  Reader params;
  undefined1 local_108 [16];
  CapTableReader *pCStack_f8;
  Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  local_f0;
  Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  local_b8;
  StructReader local_78;
  undefined1 local_48 [16];
  Maybe<capnp::MessageSize> local_38;
  
  (**(code **)*in_RDX)(&local_f0);
  local_b8.super_Builder._builder.data = local_f0.super_Builder._builder.data;
  local_b8.super_Builder._builder.pointers = local_f0.super_Builder._builder.pointers;
  local_b8.super_Builder._builder.segment = local_f0.super_Builder._builder.segment;
  local_b8.super_Builder._builder.capTable = local_f0.super_Builder._builder.capTable;
  PointerReader::getStruct(&local_78,(PointerReader *)&local_b8,(word *)0x0);
  pWVar6 = local_78.pointers;
  if (local_78.pointerCount == 0) {
    local_78.nestingLimit = 0x7fffffff;
    local_78.segment = (SegmentReader *)0x0;
    pWVar6 = (WirePointer *)0x0;
    local_78.capTable = (CapTableReader *)0x0;
  }
  local_f0.super_Builder._builder.pointers =
       (WirePointer *)CONCAT44(local_f0.super_Builder._builder.pointers._4_4_,local_78.nestingLimit)
  ;
  local_f0.super_Builder._builder.segment = (SegmentBuilder *)local_78.segment;
  local_f0.super_Builder._builder.capTable = (CapTableBuilder *)local_78.capTable;
  local_f0.super_Builder._builder.data = pWVar6;
  PointerReader::getCapability((PointerReader *)local_48);
  local_108._8_8_ = local_48._0_8_;
  pCStack_f8 = (CapTableReader *)local_48._8_8_;
  local_108._0_8_ = &capnproto_test::capnp::test::TestMembrane::Thing::Client::typeinfo;
  local_38.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Thing::Client::passThroughRequest
            (&local_b8,(Client *)local_108,&local_38);
  pCVar1 = pCStack_f8;
  __buf = extraout_RDX;
  if (pCStack_f8 != (CapTableReader *)0x0) {
    pCStack_f8 = (CapTableReader *)0x0;
    (*(code *)(*(Arena **)local_108._8_8_)->_vptr_Arena)
              (local_108._8_8_,
               pCVar1->_vptr_CapTableReader[-2] + (long)&pCVar1->_vptr_CapTableReader);
    __buf = extraout_RDX_00;
  }
  if ((local_78.dataSize == 0) || ((*local_78.data & 1) == 0)) {
    Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
    ::send(&local_f0,(int)&local_b8,__buf,(size_t)pWVar6,in_R8D);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(Own<kj::_::PromiseNode> *)&local_f0,
               kj::_::
               TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane-test.c++:68:11),_kj::_::PropagateException>
               ::anon_class_8_1_bc11688f_for_func::operator());
    pDVar4 = local_f0.hook.disposer;
    uVar3 = local_f0.super_Builder._builder._32_8_;
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0062e468;
    this_00[1].super_PromiseNode._vptr_PromiseNode = in_RDX;
    (this->super_Server)._vptr_Server =
         (_func_int **)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>,capnp::_::(anonymous_namespace)::TestMembraneImpl::callPassThrough(capnp::CallContext<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,capnproto_test::capnp::test::TestMembrane::Result>)::{lambda(capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>&&)#1},kj::_::PropagateException>>
          ::instance;
    *(TransformPromiseNodeBase **)&(this->super_Server).field_0x8 = this_00;
    pPVar7 = extraout_RDX_01;
    if (local_f0.super_Builder._builder._32_8_ != 0) {
      local_f0.super_Builder._builder.dataSize = 0;
      local_f0.super_Builder._builder.pointerCount = 0;
      local_f0.super_Builder._builder._38_2_ = 0;
      local_f0.hook.disposer = (Disposer *)0x0;
      (**(local_f0.hook.ptr)->_vptr_RequestHook)(local_f0.hook.ptr,uVar3,8,pDVar4,pDVar4,0);
      pPVar7 = extraout_RDX_02;
    }
    pWVar6 = local_f0.super_Builder._builder.pointers;
    if (local_f0.super_Builder._builder.pointers != (WirePointer *)0x0) {
      local_f0.super_Builder._builder.pointers = (WirePointer *)0x0;
      (**(code **)*local_f0.super_Builder._builder.data)
                (local_f0.super_Builder._builder.data,
                 (long)&(pWVar6->offsetAndKind).value + *(long *)((long)*pWVar6 + -0x10));
      pPVar7 = extraout_RDX_03;
    }
    pCVar2 = local_f0.super_Builder._builder.capTable;
    if (&(local_f0.super_Builder._builder.capTable)->super_CapTableReader != (CapTableReader *)0x0)
    {
      local_f0.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
      (*(code *)(((local_f0.super_Builder._builder.segment)->super_SegmentReader).arena)->
                _vptr_Arena)
                (local_f0.super_Builder._builder.segment,
                 (pCVar2->super_CapTableReader)._vptr_CapTableReader[-2] +
                 (long)&pCVar2->super_CapTableReader);
      pPVar7 = extraout_RDX_04;
    }
  }
  else {
    (**(code **)(*in_RDX + 0x18))(this);
    pPVar7 = extraout_RDX_05;
  }
  pRVar5 = local_b8.hook.ptr;
  if (local_b8.hook.ptr != (RequestHook *)0x0) {
    local_b8.hook.ptr = (RequestHook *)0x0;
    (**(local_b8.hook.disposer)->_vptr_Disposer)
              (local_b8.hook.disposer,
               pRVar5->_vptr_RequestHook[-2] + (long)&pRVar5->_vptr_RequestHook);
    pPVar7 = extraout_RDX_06;
  }
  PVar8.super_PromiseBase.node.ptr = pPVar7;
  PVar8.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar8.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> callPassThrough(CallPassThroughContext context) override {
    auto params = context.getParams();
    auto req = params.getThing().passThroughRequest();
    if (params.getTailCall()) {
      return context.tailCall(kj::mv(req));
    } else {
      return req.send().then(
          [KJ_CPCAP(context)](Response<test::TestMembrane::Result>&& result) mutable {
        context.setResults(result);
      });
    }